

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_helper.c
# Opt level: O0

int scale_image_RGB_to_NTSC_safe(uchar *orig,int width,int height,int channels)

{
  uchar auStack_138 [8];
  uchar scale_LUT [256];
  int nc;
  int j;
  int i;
  float scale_hi;
  float scale_lo;
  int channels_local;
  int height_local;
  int width_local;
  uchar *orig_local;
  
  if ((((width < 1) || (height < 1)) || (channels < 1)) || (orig == (uchar *)0x0)) {
    orig_local._4_4_ = 0;
  }
  else {
    for (nc = 0; nc < 0x100; nc = nc + 1) {
      auStack_138[nc] = (uchar)(int)(((float)nc * 219.99799) / 255.0 + 15.501);
    }
    scale_LUT._248_4_ = channels - (1 - (channels & 1U));
    for (nc = 0; nc < width * height * channels; nc = channels + nc) {
      scale_LUT[0xfc] = '\0';
      scale_LUT[0xfd] = '\0';
      scale_LUT[0xfe] = '\0';
      scale_LUT[0xff] = '\0';
      for (; (int)scale_LUT._252_4_ < (int)scale_LUT._248_4_;
          scale_LUT._252_4_ = scale_LUT._252_4_ + 1) {
        orig[nc + scale_LUT._252_4_] = auStack_138[orig[nc + scale_LUT._252_4_]];
      }
    }
    orig_local._4_4_ = 1;
  }
  return orig_local._4_4_;
}

Assistant:

int
	scale_image_RGB_to_NTSC_safe
	(
		unsigned char* orig,
		int width, int height, int channels
	)
{
	const float scale_lo = 16.0f - 0.499f;
	const float scale_hi = 235.0f + 0.499f;
	int i, j;
	int nc = channels;
	unsigned char scale_LUT[256];
	/*	error check	*/
	if( (width < 1) || (height < 1) ||
		(channels < 1) || (orig == NULL) )
	{
		/*	nothing to do	*/
		return 0;
	}
	/*	set up the scaling Look Up Table	*/
	for( i = 0; i < 256; ++i )
	{
		scale_LUT[i] = (unsigned char)((scale_hi - scale_lo) * i / 255.0f + scale_lo);
	}
	/*	for channels = 2 or 4, ignore the alpha component	*/
	nc -= 1 - (channels & 1);
	/*	OK, go through the image and scale any non-alpha components	*/
	for( i = 0; i < width*height*channels; i += channels )
	{
		for( j = 0; j < nc; ++j )
		{
			orig[i+j] = scale_LUT[orig[i+j]];
		}
	}
	return 1;
}